

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

string * i2p::SwapBase64(string *from)

{
  char cVar1;
  long lVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  string *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  string *to;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  size_type in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  value_type in_stack_ffffffffffffff7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined8 local_38;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            (in_stack_ffffffffffffff68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (in_stack_ffffffffffffff68,0x9136e9);
  for (local_38 = 0;
      sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        (in_stack_ffffffffffffff68), local_38 < sVar3; local_38 = local_38 + 1) {
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                        in_stack_ffffffffffffff70);
    cVar1 = *pvVar4;
    if (cVar1 == '+') {
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70);
      *pvVar5 = '-';
    }
    else if (cVar1 == '-') {
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70);
      *pvVar5 = '+';
    }
    else if (cVar1 == '/') {
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70);
      *pvVar5 = '~';
    }
    else if (cVar1 == '~') {
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70);
      *pvVar5 = '/';
    }
    else {
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff7f = *pvVar4;
      pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff70);
      *pvVar5 = in_stack_ffffffffffffff7f;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static std::string SwapBase64(const std::string& from)
{
    std::string to;
    to.resize(from.size());
    for (size_t i = 0; i < from.size(); ++i) {
        switch (from[i]) {
        case '-':
            to[i] = '+';
            break;
        case '~':
            to[i] = '/';
            break;
        case '+':
            to[i] = '-';
            break;
        case '/':
            to[i] = '~';
            break;
        default:
            to[i] = from[i];
            break;
        }
    }
    return to;
}